

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_import_raw
              (mbedtls_rsa_context *ctx,uchar *N,size_t N_len,uchar *P,size_t P_len,uchar *Q,
              size_t Q_len,uchar *D,size_t D_len,uchar *E,size_t E_len)

{
  size_t sVar1;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  mbedtls_mpi *in_R8;
  uchar *in_R9;
  int ret;
  uint in_stack_ffffffffffffffc0;
  int low;
  int local_4;
  
  low = 0;
  if (in_RSI != 0) {
    low = mbedtls_mpi_read_binary(in_R8,in_R9,(ulong)in_stack_ffffffffffffffc0);
    if (low != 0) goto LAB_008814e8;
    sVar1 = mbedtls_mpi_size((mbedtls_mpi *)0x881413);
    *(size_t *)(in_RDI + 8) = sVar1;
  }
  if ((((in_RCX == 0) ||
       (low = mbedtls_mpi_read_binary(in_R8,in_R9,CONCAT44(low,in_stack_ffffffffffffffc0)), low == 0
       )) && ((in_R9 == (uchar *)0x0 ||
              (low = mbedtls_mpi_read_binary(in_R8,in_R9,CONCAT44(low,in_stack_ffffffffffffffc0)),
              low == 0)))) &&
     (((Q == (uchar *)0x0 ||
       (low = mbedtls_mpi_read_binary(in_R8,in_R9,CONCAT44(low,in_stack_ffffffffffffffc0)), low == 0
       )) && (P != (uchar *)0x0)))) {
    low = mbedtls_mpi_read_binary(in_R8,in_R9,CONCAT44(low,in_stack_ffffffffffffffc0));
  }
LAB_008814e8:
  if (low == 0) {
    local_4 = 0;
  }
  else {
    local_4 = mbedtls_error_add(-0x4080,low,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                ,0x273);
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_import_raw(mbedtls_rsa_context *ctx,
                           unsigned char const *N, size_t N_len,
                           unsigned char const *P, size_t P_len,
                           unsigned char const *Q, size_t Q_len,
                           unsigned char const *D, size_t D_len,
                           unsigned char const *E, size_t E_len)
{
    int ret = 0;

    if (N != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->N, N, N_len));
        ctx->len = mbedtls_mpi_size(&ctx->N);
    }

    if (P != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->P, P, P_len));
    }

    if (Q != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->Q, Q, Q_len));
    }

    if (D != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->D, D, D_len));
    }

    if (E != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->E, E, E_len));
    }

cleanup:

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
    }

    return 0;
}